

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O3

void __thiscall doctest::AssertData::~AssertData(AssertData *this)

{
  char *pcVar1;
  
  if (((this->m_decomp).field_0.buf[0x17] < '\0') &&
     (pcVar1 = (this->m_decomp).field_0.data.ptr, pcVar1 != (char *)0x0)) {
    operator_delete__(pcVar1);
  }
  if (((this->m_exception).field_0.buf[0x17] < '\0') &&
     (pcVar1 = (this->m_exception).field_0.data.ptr, pcVar1 != (char *)0x0)) {
    operator_delete__(pcVar1);
    return;
  }
  return;
}

Assistant:

struct DOCTEST_INTERFACE AssertData
    {
        // common - for all asserts
        const TestCaseData* m_test_case;
        assertType::Enum    m_at;
        const char*         m_file;
        int                 m_line;
        const char*         m_expr;
        bool                m_failed;

        // exception-related - for all asserts
        bool   m_threw;
        String m_exception;

        // for normal asserts
        String m_decomp;

        // for specific exception-related asserts
        bool        m_threw_as;
        const char* m_exception_type;
        const char* m_exception_string;
    }